

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Address * __thiscall cppnet::Address::ToIpv6(Address *this,string *ip)

{
  bool bVar1;
  string *in_RDX;
  allocator local_22;
  undefined1 local_21;
  string *local_20;
  string *ip_local;
  Address *this_local;
  string *ret;
  
  local_20 = (string *)in_RDX;
  ip_local = ip;
  this_local = this;
  bVar1 = IsIpv4(in_RDX);
  if (bVar1) {
    local_21 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"::FFFF:",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    std::__cxx11::string::append((string *)this);
  }
  else {
    std::__cxx11::string::string((string *)this,local_20);
  }
  return this;
}

Assistant:

std::string Address::ToIpv6(const std::string& ip) {
    if (!IsIpv4(ip)) {
        return ip;
    }
    
    std::string ret("::FFFF:");
    ret.append(ip);
    return ret;
}